

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdhuff.c
# Opt level: O2

boolean decode_mcu_AC_first(j_decompress_ptr cinfo,JBLOCKROW *MCU_data)

{
  int iVar1;
  jpeg_entropy_decoder *pjVar2;
  int *piVar3;
  JBLOCKROW paJVar4;
  d_derived_tbl *htbl;
  jpeg_source_mgr *pjVar5;
  boolean bVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  int bits_left;
  _func_void_j_decompress_ptr *get_buffer;
  int min_bits;
  uint nbits;
  int iVar10;
  uint nbits_00;
  int iVar11;
  bitread_working_state br_state;
  
  pjVar2 = cinfo->entropy;
  if (((cinfo->restart_interval == 0) || (*(int *)&pjVar2[3].decode_mcu != 0)) ||
     (bVar6 = process_restart(cinfo), bVar6 != 0)) {
    if (*(int *)((long)&pjVar2[3].start_pass + 4) == 0) {
      if (*(int *)&pjVar2[2].start_pass == 0) {
        iVar11 = cinfo->Se;
        iVar1 = cinfo->Al;
        piVar3 = cinfo->natural_order;
        br_state.next_input_byte = cinfo->src->next_input_byte;
        br_state.bytes_in_buffer = cinfo->src->bytes_in_buffer;
        get_buffer = pjVar2[1].start_pass;
        bits_left = *(int *)&pjVar2[1].decode_mcu;
        paJVar4 = *MCU_data;
        htbl = (d_derived_tbl *)pjVar2[6].start_pass;
        br_state.cinfo = cinfo;
        for (iVar10 = cinfo->Ss; iVar10 <= iVar11; iVar10 = iVar10 + 1) {
          if (bits_left < 8) {
            bVar6 = jpeg_fill_bit_buffer(&br_state,(bit_buf_type)get_buffer,bits_left,0);
            if (bVar6 == 0) {
              return 0;
            }
            min_bits = 1;
            get_buffer = (_func_void_j_decompress_ptr *)br_state.get_buffer;
            bits_left = br_state.bits_left;
            if (7 < br_state.bits_left) goto LAB_0023e831;
LAB_0023e85c:
            uVar7 = jpeg_huff_decode(&br_state,(bit_buf_type)get_buffer,bits_left,htbl,min_bits);
            get_buffer = (_func_void_j_decompress_ptr *)br_state.get_buffer;
            bits_left = br_state.bits_left;
            if ((int)uVar7 < 0) goto LAB_0023e99c;
          }
          else {
LAB_0023e831:
            uVar9 = (long)get_buffer >> ((char)bits_left - 8U & 0x3f) & 0xff;
            if (htbl->look_nbits[uVar9] == 0) {
              min_bits = 9;
              goto LAB_0023e85c;
            }
            uVar7 = (uint)htbl->look_sym[uVar9];
            bits_left = bits_left - htbl->look_nbits[uVar9];
          }
          nbits = uVar7 >> 4;
          nbits_00 = uVar7 & 0xf;
          if (nbits_00 == 0) {
            if (nbits != 0xf) {
              iVar11 = 1 << ((byte)nbits & 0x1f);
              if (0xf < uVar7) {
                if ((bits_left < (int)nbits) &&
                   (bVar6 = jpeg_fill_bit_buffer(&br_state,(bit_buf_type)get_buffer,bits_left,nbits)
                   , get_buffer = (_func_void_j_decompress_ptr *)br_state.get_buffer,
                   bits_left = br_state.bits_left, bVar6 == 0)) goto LAB_0023e99c;
                bits_left = bits_left - nbits;
                iVar11 = ((uint)((long)get_buffer >> ((byte)bits_left & 0x3f)) & bmask[nbits]) +
                         iVar11;
              }
              iVar11 = iVar11 + -1;
              goto LAB_0023e963;
            }
            iVar10 = iVar10 + 0xf;
          }
          else {
            if ((bits_left < (int)nbits_00) &&
               (bVar6 = jpeg_fill_bit_buffer(&br_state,(bit_buf_type)get_buffer,bits_left,nbits_00),
               get_buffer = (_func_void_j_decompress_ptr *)br_state.get_buffer,
               bits_left = br_state.bits_left, bVar6 == 0)) goto LAB_0023e99c;
            bits_left = bits_left - nbits_00;
            uVar8 = (uint)((long)get_buffer >> ((byte)bits_left & 0x3f)) & bmask[nbits_00];
            uVar7 = 0;
            if ((int)uVar8 <= bmask[nbits_00 - 1]) {
              uVar7 = bmask[nbits_00];
            }
            iVar10 = nbits + iVar10;
            (*paJVar4)[piVar3[iVar10]] = (JCOEF)(uVar8 - uVar7 << ((byte)iVar1 & 0x1f));
          }
        }
        iVar11 = 0;
LAB_0023e963:
        pjVar5 = cinfo->src;
        pjVar5->next_input_byte = br_state.next_input_byte;
        pjVar5->bytes_in_buffer = br_state.bytes_in_buffer;
        pjVar2[1].start_pass = get_buffer;
        *(int *)&pjVar2[1].decode_mcu = bits_left;
      }
      else {
        iVar11 = *(int *)&pjVar2[2].start_pass + -1;
      }
      *(int *)&pjVar2[2].start_pass = iVar11;
    }
    bVar6 = 1;
    *(int *)&pjVar2[3].decode_mcu = *(int *)&pjVar2[3].decode_mcu + -1;
  }
  else {
LAB_0023e99c:
    bVar6 = 0;
  }
  return bVar6;
}

Assistant:

METHODDEF(boolean)
decode_mcu_AC_first (j_decompress_ptr cinfo, JBLOCKROW *MCU_data)
{   
  huff_entropy_ptr entropy = (huff_entropy_ptr) cinfo->entropy;
  register int s, k, r;
  unsigned int EOBRUN;
  int Se, Al;
  const int * natural_order;
  JBLOCKROW block;
  BITREAD_STATE_VARS;
  d_derived_tbl * tbl;

  /* Process restart marker if needed; may have to suspend */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0)
      if (! process_restart(cinfo))
	return FALSE;
  }

  /* If we've run out of data, just leave the MCU set to zeroes.
   * This way, we return uniform gray for the remainder of the segment.
   */
  if (! entropy->insufficient_data) {

    Se = cinfo->Se;
    Al = cinfo->Al;
    natural_order = cinfo->natural_order;

    /* Load up working state.
     * We can avoid loading/saving bitread state if in an EOB run.
     */
    EOBRUN = entropy->saved.EOBRUN;	/* only part of saved state we need */

    /* There is always only one block per MCU */

    if (EOBRUN > 0)		/* if it's a band of zeroes... */
      EOBRUN--;			/* ...process it now (we do nothing) */
    else {
      BITREAD_LOAD_STATE(cinfo,entropy->bitstate);
      block = MCU_data[0];
      tbl = entropy->ac_derived_tbl;

      for (k = cinfo->Ss; k <= Se; k++) {
	HUFF_DECODE(s, br_state, tbl, return FALSE, label2);
	r = s >> 4;
	s &= 15;
	if (s) {
	  k += r;
	  CHECK_BIT_BUFFER(br_state, s, return FALSE);
	  r = GET_BITS(s);
	  s = HUFF_EXTEND(r, s);
	  /* Scale and output coefficient in natural (dezigzagged) order */
	  (*block)[natural_order[k]] = (JCOEF) (s << Al);
	} else {
	  if (r == 15) {	/* ZRL */
	    k += 15;		/* skip 15 zeroes in band */
	  } else {		/* EOBr, run length is 2^r + appended bits */
	    EOBRUN = 1 << r;
	    if (r) {		/* EOBr, r > 0 */
	      CHECK_BIT_BUFFER(br_state, r, return FALSE);
	      r = GET_BITS(r);
	      EOBRUN += r;
	    }
	    EOBRUN--;		/* this band is processed at this moment */
	    break;		/* force end-of-band */
	  }
	}
      }

      BITREAD_SAVE_STATE(cinfo,entropy->bitstate);
    }

    /* Completed MCU, so update state */
    entropy->saved.EOBRUN = EOBRUN;	/* only part of saved state we need */
  }

  /* Account for restart interval (no-op if not using restarts) */
  entropy->restarts_to_go--;

  return TRUE;
}